

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymesh_info.cpp
# Opt level: O3

ostream * CGL::Collada::operator<<(ostream *os,PolymeshInfo *polymesh)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"PolymeshInfo: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(polymesh->super_Instance).name._M_dataplus._M_p,
                      (polymesh->super_Instance).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (id:",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(polymesh->super_Instance).id._M_dataplus._M_p,
                      (polymesh->super_Instance).id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(os," [",2);
  std::__ostream_insert<char,std::char_traits<char>>(os," num_polygons=",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os," num_vertices=",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os," num_normals=",0xd);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os," num_texcoords=",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const PolymeshInfo& polymesh ) {

  os << "PolymeshInfo: " << polymesh.name << " (id:" << polymesh.id << ")";

  os << " [";

    os << " num_polygons="  << polymesh.polygons.size();
    os << " num_vertices="  << polymesh.vertices.size();
    os << " num_normals="   << polymesh.normals.size();
    os << " num_texcoords=" << polymesh.texcoords.size();

  os << " ]";

  return os;

}